

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O3

void basist::encode_bc7_block(void *pBlock,bc7_optimization_results *pResults)

{
  byte bVar1;
  undefined1 uVar2;
  undefined4 uVar3;
  uint32_t uVar4;
  char cVar5;
  uint uVar6;
  byte bVar7;
  uint32_t i;
  byte *pbVar8;
  long lVar9;
  uint32_t subset;
  uint uVar10;
  undefined1 *puVar11;
  ulong uVar12;
  undefined8 *puVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  undefined8 *puVar18;
  ulong uVar19;
  long lVar20;
  uint uVar21;
  long lVar22;
  uint uVar23;
  bool bVar24;
  uint32_t auVar25 [2];
  color_quad_u8 high [3];
  color_quad_u8 low [3];
  uint8_t color_selectors [16];
  uint8_t alpha_selectors [16];
  uint32_t pbits [3] [2];
  ulong local_a8;
  uint local_a0;
  undefined8 local_98;
  undefined4 local_90;
  undefined8 local_88;
  undefined4 local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  ulong local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  uint32_t local_48 [3] [2];
  
  uVar6 = pResults->m_mode;
  uVar12 = (ulong)uVar6;
  bVar1 = *(byte *)((long)&g_bc7_num_subsets + uVar12);
  local_60 = (ulong)bVar1;
  if (uVar12 - 4 < 3) {
    puVar11 = &g_bc7_partition1;
  }
  else {
    uVar23 = pResults->m_partition << 4;
    if ((0x8aUL >> (uVar12 & 0x3f) & 1) == 0) {
      puVar11 = g_bc7_partition3 + uVar23;
    }
    else {
      puVar11 = g_bc7_partition2 + uVar23;
    }
  }
  local_78 = *(undefined8 *)pResults->m_selectors;
  uStack_70 = *(undefined8 *)(pResults->m_selectors + 8);
  local_58 = *(undefined8 *)pResults->m_alpha_selectors;
  uStack_50 = *(undefined8 *)(pResults->m_alpha_selectors + 8);
  puVar18 = &local_88;
  local_88 = *(undefined8 *)pResults->m_low;
  local_80 = *(undefined4 *)pResults->m_low[2].m_c;
  puVar13 = &local_98;
  local_98 = *(undefined8 *)pResults->m_high;
  local_90 = *(undefined4 *)pResults->m_high[2].m_c;
  local_48[2] = pResults->m_pbits[2];
  local_48[0] = pResults->m_pbits[0];
  local_48[1] = pResults->m_pbits[1];
  local_a0 = 0xffffffff;
  local_a8 = 0xffffffffffffffff;
  cVar5 = (char)pResults->m_index_selector;
  uVar23 = 1 << (*(char *)((long)&g_bc7_color_index_bitcount + (long)(int)uVar6) + cVar5 & 0x1fU);
  uVar14 = 0;
  do {
    if (uVar14 == 0) {
      bVar7 = 0;
    }
    else {
      if (uVar14 == 1 && (uVar6 & 0xfffffffd) == 0) {
        pbVar8 = g_bc7_table_anchor_index_third_subset_1 + pResults->m_partition;
      }
      else if (uVar14 == 2 && (uVar6 & 0xfffffffd) == 0) {
        pbVar8 = g_bc7_table_anchor_index_third_subset_2 + pResults->m_partition;
      }
      else {
        pbVar8 = g_bc7_table_anchor_index_second_subset + pResults->m_partition;
      }
      bVar7 = *pbVar8;
    }
    *(uint *)((long)&local_a8 + uVar14 * 4) = (uint)bVar7;
    if ((uVar23 >> 1 & (uint)*(byte *)((long)&local_78 + (ulong)bVar7)) == 0) {
LAB_001318ae:
      if (((uVar6 & 0xfffffffe) == 4) &&
         (uVar15 = 1 << (*(char *)((long)&g_bc7_alpha_index_bitcount + (long)(int)uVar6) - cVar5 &
                        0x1fU), (uVar15 >> 1 & (uint)*(byte *)((long)&local_58 + (ulong)bVar7)) != 0
         )) {
        lVar9 = 0;
        do {
          if (uVar14 == (byte)puVar11[lVar9]) {
            *(byte *)((long)&local_58 + lVar9) = ~*(byte *)((long)&local_58 + lVar9) + (char)uVar15;
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 != 0x10);
        uVar2 = *(undefined1 *)((long)&local_88 + uVar14 * 4 + 3);
        *(undefined1 *)((long)&local_88 + uVar14 * 4 + 3) =
             *(undefined1 *)((long)&local_98 + uVar14 * 4 + 3);
        *(undefined1 *)((long)&local_98 + uVar14 * 4 + 3) = uVar2;
      }
    }
    else {
      lVar9 = 0;
      do {
        if (uVar14 == (byte)puVar11[lVar9]) {
          *(byte *)((long)&local_78 + lVar9) = ~*(byte *)((long)&local_78 + lVar9) + (char)uVar23;
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0x10);
      if ((uVar6 & 0xfffffffe) == 4) {
        lVar9 = 0;
        do {
          uVar2 = *(undefined1 *)((long)puVar18 + lVar9);
          *(undefined1 *)((long)puVar18 + lVar9) = *(undefined1 *)((long)puVar13 + lVar9);
          *(undefined1 *)((long)puVar13 + lVar9) = uVar2;
          lVar9 = lVar9 + 1;
        } while (lVar9 != 3);
      }
      else {
        uVar3 = *(undefined4 *)((long)&local_88 + uVar14 * 4);
        *(undefined4 *)((long)&local_88 + uVar14 * 4) =
             *(undefined4 *)((long)&local_98 + uVar14 * 4);
        *(undefined4 *)((long)&local_98 + uVar14 * 4) = uVar3;
      }
      if (uVar6 != 1) {
        auVar25[1] = SUB84(local_48[uVar14],0);
        auVar25[0] = SUB84(local_48[uVar14],4);
        local_48[uVar14] = auVar25;
        goto LAB_001318ae;
      }
    }
    uVar14 = uVar14 + 1;
    puVar18 = (undefined8 *)((long)puVar18 + 4);
    puVar13 = (undefined8 *)((long)puVar13 + 4);
  } while (uVar14 != (uint)bVar1 + (uint)(bVar1 == 0));
  uVar14 = 1L << ((byte)uVar6 & 0x3f);
  *(undefined1 (*) [16])pBlock = (undefined1  [16])0x0;
  uVar23 = uVar6 + 1;
  if ((0x20 < uVar23) || (uVar14 >> ((byte)uVar23 & 0x3f) != 0)) goto LAB_00131eb1;
  if (uVar23 == 0) {
    bVar24 = false;
    uVar15 = 0;
  }
  else {
    uVar21 = 0;
    do {
      uVar16 = 8 - (uVar21 & 7);
      if (uVar23 <= uVar16) {
        uVar16 = uVar23;
      }
      uVar15 = uVar16 + uVar21;
      pbVar8 = (byte *)((long)pBlock + (ulong)(uVar21 >> 3));
      *pbVar8 = *pbVar8 | (byte)((uint)uVar14 << (sbyte)(uVar21 & 7));
      uVar14 = (ulong)((uint)uVar14 >> ((byte)uVar16 & 0x1f));
      uVar23 = uVar23 - uVar16;
      uVar21 = uVar15;
    } while (uVar23 != 0);
    if (0x80 < uVar15) goto LAB_00131ed0;
    bVar24 = (uVar6 & 0xfffffffe) == 4;
    if (bVar24) {
      uVar23 = pResults->m_rotation;
      if (3 < uVar23) goto LAB_00131eb1;
      uVar16 = 2;
      do {
        uVar10 = 8 - (uVar21 & 7);
        if (uVar16 <= uVar10) {
          uVar10 = uVar16;
        }
        uVar15 = uVar10 + uVar21;
        pbVar8 = (byte *)((long)pBlock + (ulong)(uVar21 >> 3));
        *pbVar8 = *pbVar8 | (byte)(uVar23 << (sbyte)(uVar21 & 7));
        uVar23 = uVar23 >> ((byte)uVar10 & 0x1f);
        uVar16 = uVar16 - uVar10;
        uVar21 = uVar15;
      } while (uVar16 != 0);
      if (0x80 < uVar15) goto LAB_00131ed0;
      if (uVar6 == 4) {
        if (1 < pResults->m_index_selector) goto LAB_00131eb1;
        pbVar8 = (byte *)((long)pBlock + (ulong)(uVar15 >> 3));
        *pbVar8 = *pbVar8 | (byte)(pResults->m_index_selector << ((byte)uVar15 & 7));
        if (uVar15 == 0x80) goto LAB_00131ed0;
        uVar15 = uVar15 + 1;
      }
    }
    else {
      bVar24 = false;
    }
  }
  if (2 < uVar12 - 4) {
    uVar23 = pResults->m_partition;
    uVar16 = (uint)((0x8eUL >> (uVar12 & 0x3f) & 1) != 0) * 2 + 4;
    uVar21 = uVar15;
    if (uVar23 >> (sbyte)uVar16 != 0) {
LAB_00131eb1:
      __assert_fail("(num_bits <= 32) && (val < (1ULL << num_bits))",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                    ,0x2cf1,
                    "void basist::bc7_set_block_bits(uint8_t *, uint32_t, uint32_t, uint32_t *)");
    }
    do {
      uVar10 = 8 - (uVar21 & 7);
      if (uVar16 <= uVar10) {
        uVar10 = uVar16;
      }
      uVar15 = uVar10 + uVar21;
      pbVar8 = (byte *)((long)pBlock + (ulong)(uVar21 >> 3));
      *pbVar8 = *pbVar8 | (byte)(uVar23 << (sbyte)(uVar21 & 7));
      uVar23 = uVar23 >> ((byte)uVar10 & 0x1f);
      uVar16 = uVar16 - uVar10;
      uVar21 = uVar15;
    } while (uVar16 != 0);
    if (0x80 < uVar15) {
LAB_00131ed0:
      __assert_fail("*pCur_ofs <= 128",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                    ,0x2cfa,
                    "void basist::bc7_set_block_bits(uint8_t *, uint32_t, uint32_t, uint32_t *)");
    }
  }
  uVar14 = (ulong)((int)local_60 + (uint)((int)local_60 == 0));
  lVar9 = 0;
  do {
    uVar19 = 0;
    do {
      if (lVar9 == 3) {
        uVar23 = (uint)*(char *)((long)&g_bc7_alpha_precision_table + uVar12);
      }
      else {
        uVar23 = (uint)*(byte *)((long)&g_bc7_color_precision_table + uVar12);
      }
      bVar1 = *(byte *)((long)&local_88 + uVar19 * 4 + lVar9);
      uVar21 = (uint)bVar1;
      if ((0x20 < uVar23) || (bVar1 >> ((byte)uVar23 & 0x3f) != 0)) goto LAB_00131eb1;
      uVar16 = uVar15;
      if (uVar23 != 0) {
        do {
          uVar10 = 8 - (uVar16 & 7);
          if (uVar23 <= uVar10) {
            uVar10 = uVar23;
          }
          uVar15 = uVar10 + uVar16;
          pbVar8 = (byte *)((long)pBlock + (ulong)(uVar16 >> 3));
          *pbVar8 = *pbVar8 | (byte)(uVar21 << (sbyte)(uVar16 & 7));
          uVar21 = uVar21 >> ((byte)uVar10 & 0x1f);
          uVar23 = uVar23 - uVar10;
          uVar16 = uVar15;
        } while (uVar23 != 0);
        if (0x80 < uVar15) goto LAB_00131ed0;
      }
      if (lVar9 == 3) {
        uVar23 = (uint)*(char *)((long)&g_bc7_alpha_precision_table + uVar12);
      }
      else {
        uVar23 = (uint)*(byte *)((long)&g_bc7_color_precision_table + uVar12);
      }
      bVar1 = *(byte *)((long)&local_98 + uVar19 * 4 + lVar9);
      uVar21 = (uint)bVar1;
      if ((0x20 < uVar23) || (bVar1 >> ((byte)uVar23 & 0x3f) != 0)) goto LAB_00131eb1;
      uVar16 = uVar15;
      if (uVar23 != 0) {
        do {
          uVar10 = 8 - (uVar16 & 7);
          if (uVar23 <= uVar10) {
            uVar10 = uVar23;
          }
          uVar15 = uVar10 + uVar16;
          pbVar8 = (byte *)((long)pBlock + (ulong)(uVar16 >> 3));
          *pbVar8 = *pbVar8 | (byte)(uVar21 << (sbyte)(uVar16 & 7));
          uVar21 = uVar21 >> ((byte)uVar10 & 0x1f);
          uVar23 = uVar23 - uVar10;
          uVar16 = uVar15;
        } while (uVar23 != 0);
        if (0x80 < uVar15) goto LAB_00131ed0;
      }
      uVar19 = uVar19 + 1;
    } while (uVar19 != uVar14);
    lVar9 = lVar9 + 1;
  } while (lVar9 != 4 - (ulong)(uVar6 < 4));
  if ((0x34UL >> (uVar12 & 0x3f) & 1) == 0) {
    uVar12 = 0;
    do {
      if (1 < local_48[uVar12][0]) goto LAB_00131eb1;
      pbVar8 = (byte *)((long)pBlock + (ulong)(uVar15 >> 3));
      *pbVar8 = *pbVar8 | (byte)(local_48[uVar12][0] << ((byte)uVar15 & 7));
      uVar23 = uVar15 + 1;
      if (0x80 < uVar23) goto LAB_00131ed0;
      if (uVar6 != 1) {
        if (1 < local_48[uVar12][1]) goto LAB_00131eb1;
        pbVar8 = (byte *)((long)pBlock + (ulong)(uVar23 >> 3));
        *pbVar8 = *pbVar8 | (byte)(local_48[uVar12][1] << ((byte)uVar23 & 7));
        uVar23 = uVar15 + 2;
        if (0x80 < uVar15 + 2) goto LAB_00131ed0;
      }
      uVar15 = uVar23;
      uVar12 = uVar12 + 1;
    } while (uVar14 != uVar12);
  }
  uVar12 = (ulong)uVar15;
  lVar22 = (long)(int)uVar6;
  lVar9 = 0;
  do {
    lVar20 = 0;
    do {
      uVar4 = pResults->m_index_selector;
      if (uVar4 == 0) {
        uVar6 = (uint)*(byte *)((long)&g_bc7_color_index_bitcount + lVar22);
      }
      else {
        uVar6 = *(byte *)((long)&g_bc7_alpha_index_bitcount + lVar22) - uVar4;
      }
      uVar14 = lVar20 + lVar9 * 4;
      uVar6 = uVar6 - (uVar14 == local_a0 ||
                      (uVar14 == local_a8 >> 0x20 || uVar14 == (local_a8 & 0xffffffff)));
      puVar18 = &local_58;
      if (uVar4 == 0) {
        puVar18 = &local_78;
      }
      uVar23 = (uint)*(byte *)((long)puVar18 + uVar14);
      if ((0x20 < uVar6) || (*(byte *)((long)puVar18 + uVar14) >> ((byte)uVar6 & 0x3f) != 0))
      goto LAB_00131eb1;
      uVar14 = uVar12;
      if (uVar6 != 0) {
        do {
          uVar21 = (uint)uVar14 & 7;
          uVar15 = 8 - uVar21;
          if (uVar6 <= uVar15) {
            uVar15 = uVar6;
          }
          uVar16 = uVar15 + (uint)uVar14;
          uVar12 = (ulong)uVar16;
          pbVar8 = (byte *)((long)pBlock + (uVar14 >> 3));
          *pbVar8 = *pbVar8 | (byte)(uVar23 << (sbyte)uVar21);
          uVar23 = uVar23 >> ((byte)uVar15 & 0x1f);
          uVar6 = uVar6 - uVar15;
          uVar14 = uVar12;
        } while (uVar6 != 0);
        if (0x80 < uVar16) goto LAB_00131ed0;
      }
      iVar17 = (int)uVar12;
      lVar20 = lVar20 + 1;
    } while (lVar20 != 4);
    lVar9 = lVar9 + 1;
  } while (lVar9 != 4);
  if (bVar24) {
    lVar9 = 0;
    do {
      lVar20 = 0;
      do {
        uVar4 = pResults->m_index_selector;
        if (uVar4 == 0) {
          uVar6 = (uint)*(byte *)((long)&g_bc7_alpha_index_bitcount + lVar22);
        }
        else {
          uVar6 = *(byte *)((long)&g_bc7_color_index_bitcount + lVar22) + uVar4;
        }
        uVar14 = lVar20 + lVar9 * 4;
        uVar6 = uVar6 - (uVar14 == local_a0 ||
                        (uVar14 == local_a8 >> 0x20 || uVar14 == (local_a8 & 0xffffffff)));
        puVar18 = &local_78;
        if (uVar4 == 0) {
          puVar18 = &local_58;
        }
        uVar23 = (uint)*(byte *)((long)puVar18 + uVar14);
        if ((0x20 < uVar6) || (*(byte *)((long)puVar18 + uVar14) >> ((byte)uVar6 & 0x3f) != 0))
        goto LAB_00131eb1;
        uVar14 = uVar12;
        if (uVar6 != 0) {
          do {
            uVar21 = (uint)uVar14 & 7;
            uVar15 = 8 - uVar21;
            if (uVar6 <= uVar15) {
              uVar15 = uVar6;
            }
            uVar16 = uVar15 + (uint)uVar14;
            uVar12 = (ulong)uVar16;
            pbVar8 = (byte *)((long)pBlock + (uVar14 >> 3));
            *pbVar8 = *pbVar8 | (byte)(uVar23 << (sbyte)uVar21);
            uVar23 = uVar23 >> ((byte)uVar15 & 0x1f);
            uVar6 = uVar6 - uVar15;
            uVar14 = uVar12;
          } while (uVar6 != 0);
          if (0x80 < uVar16) goto LAB_00131ed0;
        }
        iVar17 = (int)uVar12;
        lVar20 = lVar20 + 1;
      } while (lVar20 != 4);
      lVar9 = lVar9 + 1;
    } while (lVar9 != 4);
  }
  if (iVar17 != 0x80) {
    __assert_fail("cur_bit_ofs == 128",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                  ,0x2da4,"void basist::encode_bc7_block(void *, const bc7_optimization_results *)")
    ;
  }
  return;
}

Assistant:

void encode_bc7_block(void* pBlock, const bc7_optimization_results* pResults)
	{
		const uint32_t best_mode = pResults->m_mode;

		const uint32_t total_subsets = g_bc7_num_subsets[best_mode];
		const uint32_t total_partitions = 1 << g_bc7_partition_bits[best_mode];
		//const uint32_t num_rotations = 1 << g_bc7_rotation_bits[best_mode];
		//const uint32_t num_index_selectors = (best_mode == 4) ? 2 : 1;

		const uint8_t* pPartition;
		if (total_subsets == 1)
			pPartition = &g_bc7_partition1[0];
		else if (total_subsets == 2)
			pPartition = &g_bc7_partition2[pResults->m_partition * 16];
		else
			pPartition = &g_bc7_partition3[pResults->m_partition * 16];

		uint8_t color_selectors[16];
		memcpy(color_selectors, pResults->m_selectors, 16);

		uint8_t alpha_selectors[16];
		memcpy(alpha_selectors, pResults->m_alpha_selectors, 16);

		color_quad_u8 low[3], high[3];
		memcpy(low, pResults->m_low, sizeof(low));
		memcpy(high, pResults->m_high, sizeof(high));

		uint32_t pbits[3][2];
		memcpy(pbits, pResults->m_pbits, sizeof(pbits));

		int anchor[3] = { -1, -1, -1 };

		for (uint32_t k = 0; k < total_subsets; k++)
		{
			uint32_t anchor_index = 0;
			if (k)
			{
				if ((total_subsets == 3) && (k == 1))
					anchor_index = g_bc7_table_anchor_index_third_subset_1[pResults->m_partition];
				else if ((total_subsets == 3) && (k == 2))
					anchor_index = g_bc7_table_anchor_index_third_subset_2[pResults->m_partition];
				else
					anchor_index = g_bc7_table_anchor_index_second_subset[pResults->m_partition];
			}

			anchor[k] = anchor_index;

			const uint32_t color_index_bits = get_bc7_color_index_size(best_mode, pResults->m_index_selector);
			const uint32_t num_color_indices = 1 << color_index_bits;

			if (color_selectors[anchor_index] & (num_color_indices >> 1))
			{
				for (uint32_t i = 0; i < 16; i++)
					if (pPartition[i] == k)
						color_selectors[i] = (uint8_t)((num_color_indices - 1) - color_selectors[i]);

				if (get_bc7_mode_has_seperate_alpha_selectors(best_mode))
				{
					for (uint32_t q = 0; q < 3; q++)
					{
						uint8_t t = low[k].m_c[q];
						low[k].m_c[q] = high[k].m_c[q];
						high[k].m_c[q] = t;
					}
				}
				else
				{
					color_quad_u8 tmp = low[k];
					low[k] = high[k];
					high[k] = tmp;
				}

				if (!g_bc7_mode_has_shared_p_bits[best_mode])
				{
					uint32_t t = pbits[k][0];
					pbits[k][0] = pbits[k][1];
					pbits[k][1] = t;
				}
			}

			if (get_bc7_mode_has_seperate_alpha_selectors(best_mode))
			{
				const uint32_t alpha_index_bits = get_bc7_alpha_index_size(best_mode, pResults->m_index_selector);
				const uint32_t num_alpha_indices = 1 << alpha_index_bits;

				if (alpha_selectors[anchor_index] & (num_alpha_indices >> 1))
				{
					for (uint32_t i = 0; i < 16; i++)
						if (pPartition[i] == k)
							alpha_selectors[i] = (uint8_t)((num_alpha_indices - 1) - alpha_selectors[i]);

					uint8_t t = low[k].m_c[3];
					low[k].m_c[3] = high[k].m_c[3];
					high[k].m_c[3] = t;
				}
			}
		}

		uint8_t* pBlock_bytes = (uint8_t*)(pBlock);
		memset(pBlock_bytes, 0, BC7ENC_BLOCK_SIZE);

		uint32_t cur_bit_ofs = 0;
		bc7_set_block_bits(pBlock_bytes, 1 << best_mode, best_mode + 1, &cur_bit_ofs);

		if ((best_mode == 4) || (best_mode == 5))
			bc7_set_block_bits(pBlock_bytes, pResults->m_rotation, 2, &cur_bit_ofs);

		if (best_mode == 4)
			bc7_set_block_bits(pBlock_bytes, pResults->m_index_selector, 1, &cur_bit_ofs);

		if (total_partitions > 1)
			bc7_set_block_bits(pBlock_bytes, pResults->m_partition, (total_partitions == 64) ? 6 : 4, &cur_bit_ofs);

		const uint32_t total_comps = (best_mode >= 4) ? 4 : 3;
		for (uint32_t comp = 0; comp < total_comps; comp++)
		{
			for (uint32_t subset = 0; subset < total_subsets; subset++)
			{
				bc7_set_block_bits(pBlock_bytes, low[subset].m_c[comp], (comp == 3) ? g_bc7_alpha_precision_table[best_mode] : g_bc7_color_precision_table[best_mode], &cur_bit_ofs);
				bc7_set_block_bits(pBlock_bytes, high[subset].m_c[comp], (comp == 3) ? g_bc7_alpha_precision_table[best_mode] : g_bc7_color_precision_table[best_mode], &cur_bit_ofs);
			}
		}

		if (g_bc7_mode_has_p_bits[best_mode])
		{
			for (uint32_t subset = 0; subset < total_subsets; subset++)
			{
				bc7_set_block_bits(pBlock_bytes, pbits[subset][0], 1, &cur_bit_ofs);
				if (!g_bc7_mode_has_shared_p_bits[best_mode])
					bc7_set_block_bits(pBlock_bytes, pbits[subset][1], 1, &cur_bit_ofs);
			}
		}

		for (uint32_t y = 0; y < 4; y++)
		{
			for (uint32_t x = 0; x < 4; x++)
			{
				int idx = x + y * 4;

				uint32_t n = pResults->m_index_selector ? get_bc7_alpha_index_size(best_mode, pResults->m_index_selector) : get_bc7_color_index_size(best_mode, pResults->m_index_selector);

				if ((idx == anchor[0]) || (idx == anchor[1]) || (idx == anchor[2]))
					n--;

				bc7_set_block_bits(pBlock_bytes, pResults->m_index_selector ? alpha_selectors[idx] : color_selectors[idx], n, &cur_bit_ofs);
			}
		}

		if (get_bc7_mode_has_seperate_alpha_selectors(best_mode))
		{
			for (uint32_t y = 0; y < 4; y++)
			{
				for (uint32_t x = 0; x < 4; x++)
				{
					int idx = x + y * 4;

					uint32_t n = pResults->m_index_selector ? get_bc7_color_index_size(best_mode, pResults->m_index_selector) : get_bc7_alpha_index_size(best_mode, pResults->m_index_selector);

					if ((idx == anchor[0]) || (idx == anchor[1]) || (idx == anchor[2]))
						n--;

					bc7_set_block_bits(pBlock_bytes, pResults->m_index_selector ? color_selectors[idx] : alpha_selectors[idx], n, &cur_bit_ofs);
				}
			}
		}

		assert(cur_bit_ofs == 128);
	}